

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O0

Gia_Man_t * Gia_ManIsoNpnReduce(Gia_Man_t *p,Vec_Ptr_t **pvPosEquivs,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Wec_t *p_00;
  Vec_Int_t *vSupp;
  Vec_Mem_t *pVVar4;
  Vec_Int_t *pVVar5;
  word *t;
  int *pPos;
  Gia_Man_t *pGVar6;
  Vec_Ptr_t *pVVar7;
  bool bVar8;
  Vec_Int_t *vTt2Class [17];
  Vec_Int_t *vFirsts;
  Vec_Int_t *vLeaves;
  Gia_Man_t *pNew;
  Vec_Mem_t *vTtMem [17];
  Gia_Obj_t *pObj;
  word *pTruth;
  Vec_Wec_t *vPosEquivs;
  int IndexVar;
  int IndexCon;
  int truthId;
  int lastId;
  int nVars;
  int uCanonPhase;
  int iObj;
  int i;
  char pCanonPerm [16];
  int fVerbose_local;
  Vec_Ptr_t **pvPosEquivs_local;
  Gia_Man_t *p_local;
  
  vPosEquivs._4_4_ = -1;
  vPosEquivs._0_4_ = -1;
  p_00 = Vec_WecAlloc(100);
  vSupp = Vec_IntAlloc(0x10);
  for (uCanonPhase = 0; uCanonPhase < 0x11; uCanonPhase = uCanonPhase + 1) {
    iVar1 = Abc_TtWordNum(uCanonPhase);
    pVVar4 = Vec_MemAlloc(iVar1,10);
    vTtMem[(long)uCanonPhase + -1] = pVVar4;
    Vec_MemHashAlloc(vTtMem[(long)uCanonPhase + -1],1000);
    iVar1 = Gia_ManCoNum(p);
    pVVar5 = Vec_IntStartFull(iVar1 + 1);
    vTt2Class[(long)uCanonPhase + -1] = pVVar5;
  }
  Gia_ObjComputeTruthTableStart(p,0x10);
  uCanonPhase = 0;
  do {
    iVar1 = uCanonPhase;
    iVar2 = Gia_ManPoNum(p);
    bVar8 = false;
    if (iVar1 < iVar2) {
      vTtMem[0x10] = (Vec_Mem_t *)Gia_ManCo(p,uCanonPhase);
      bVar8 = vTtMem[0x10] != (Vec_Mem_t *)0x0;
    }
    if (!bVar8) {
      Gia_ObjComputeTruthTableStop(p);
      Vec_IntFree(vSupp);
      for (uCanonPhase = 0; uCanonPhase < 0x11; uCanonPhase = uCanonPhase + 1) {
        Vec_MemHashFree(vTtMem[(long)uCanonPhase + -1]);
        Vec_MemFree(vTtMem[(long)uCanonPhase + -1]);
        Vec_IntFree(vTt2Class[(long)uCanonPhase + -1]);
      }
      vTt2Class[0x10] = Vec_WecCollectFirsts(p_00);
      pPos = Vec_IntArray(vTt2Class[0x10]);
      iVar1 = Vec_IntSize(vTt2Class[0x10]);
      pGVar6 = Gia_ManDupCones(p,pPos,iVar1,0);
      Vec_IntFree(vTt2Class[0x10]);
      if (fVerbose != 0) {
        printf("Nontrivial classes:\n");
        Vec_WecPrint(p_00,1);
      }
      if (pvPosEquivs != (Vec_Ptr_t **)0x0) {
        pVVar7 = Vec_WecConvertToVecPtr(p_00);
        *pvPosEquivs = pVVar7;
      }
      Vec_WecFree(p_00);
      return pGVar6;
    }
    nVars = Gia_ObjId(p,(Gia_Obj_t *)vTtMem[0x10]);
    Gia_ManCollectCis(p,&nVars,1,vSupp);
    iVar1 = Vec_IntSize(vSupp);
    if (iVar1 < 0x11) {
      vTtMem[0x10] = (Vec_Mem_t *)Gia_ObjFanin0((Gia_Obj_t *)vTtMem[0x10]);
      iVar1 = Gia_ObjIsConst0((Gia_Obj_t *)vTtMem[0x10]);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsCi((Gia_Obj_t *)vTtMem[0x10]);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsAnd((Gia_Obj_t *)vTtMem[0x10]);
          if (iVar1 == 0) {
            __assert_fail("Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTruth.c"
                          ,0x2f7,"Gia_Man_t *Gia_ManIsoNpnReduce(Gia_Man_t *, Vec_Ptr_t **, int)");
          }
          t = Gia_ObjComputeTruthTableCut(p,(Gia_Obj_t *)vTtMem[0x10],vSupp);
          iVar1 = Vec_IntSize(vSupp);
          Abc_TtMinimumBase(t,(int *)0x0,iVar1,&truthId);
          if (truthId == 0) {
            if (vPosEquivs._4_4_ == -1) {
              vPosEquivs._4_4_ = Vec_WecSize(p_00);
              Vec_WecPushLevel(p_00);
            }
            Vec_WecPush(p_00,vPosEquivs._4_4_,uCanonPhase);
          }
          else if (truthId == 1) {
            if ((int)vPosEquivs == -1) {
              vPosEquivs._0_4_ = Vec_WecSize(p_00);
              Vec_WecPushLevel(p_00);
            }
            Vec_WecPush(p_00,(int)vPosEquivs,uCanonPhase);
          }
          else {
            lastId = Abc_TtCanonicize(t,truthId,(char *)&iObj);
            iVar1 = Vec_MemEntryNum(vTtMem[(long)truthId + -1]);
            iVar2 = Vec_MemHashInsert(vTtMem[(long)truthId + -1],t);
            iVar3 = Vec_MemEntryNum(vTtMem[(long)truthId + -1]);
            if (iVar1 != iVar3) {
              iVar1 = Vec_IntEntry(vTt2Class[(long)truthId + -1],iVar2);
              if (iVar1 != -1) {
                __assert_fail("Vec_IntEntry(vTt2Class[nVars], truthId) == -1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTruth.c"
                              ,0x313,
                              "Gia_Man_t *Gia_ManIsoNpnReduce(Gia_Man_t *, Vec_Ptr_t **, int)");
              }
              pVVar5 = vTt2Class[(long)truthId + -1];
              iVar1 = Vec_WecSize(p_00);
              Vec_IntWriteEntry(pVVar5,iVar2,iVar1);
              Vec_WecPushLevel(p_00);
            }
            iVar1 = Vec_IntEntry(vTt2Class[(long)truthId + -1],iVar2);
            if (iVar1 < 0) {
              __assert_fail("Vec_IntEntry(vTt2Class[nVars], truthId) >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTruth.c"
                            ,0x317,"Gia_Man_t *Gia_ManIsoNpnReduce(Gia_Man_t *, Vec_Ptr_t **, int)")
              ;
            }
            iVar1 = Vec_IntEntry(vTt2Class[(long)truthId + -1],iVar2);
            Vec_WecPush(p_00,iVar1,uCanonPhase);
          }
        }
        else {
          if ((int)vPosEquivs == -1) {
            vPosEquivs._0_4_ = Vec_WecSize(p_00);
            Vec_WecPushLevel(p_00);
          }
          Vec_WecPush(p_00,(int)vPosEquivs,uCanonPhase);
        }
      }
      else {
        if (vPosEquivs._4_4_ == -1) {
          vPosEquivs._4_4_ = Vec_WecSize(p_00);
          Vec_WecPushLevel(p_00);
        }
        Vec_WecPush(p_00,vPosEquivs._4_4_,uCanonPhase);
      }
    }
    else {
      pVVar5 = Vec_WecPushLevel(p_00);
      Vec_IntPush(pVVar5,uCanonPhase);
    }
    uCanonPhase = uCanonPhase + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManIsoNpnReduce( Gia_Man_t * p, Vec_Ptr_t ** pvPosEquivs, int fVerbose )
{
    char pCanonPerm[16];
    int i, iObj, uCanonPhase, nVars, lastId, truthId;
    int IndexCon = -1, IndexVar = -1;
    Vec_Wec_t * vPosEquivs = Vec_WecAlloc( 100 );
    word * pTruth;
    Gia_Obj_t * pObj;
    Vec_Mem_t * vTtMem[17];   // truth table memory and hash table
    Gia_Man_t * pNew = NULL;
    Vec_Int_t * vLeaves = Vec_IntAlloc( 16 );
    Vec_Int_t * vFirsts;
    Vec_Int_t * vTt2Class[17];
    for ( i = 0; i < 17; i++ )
    {
        vTtMem[i] = Vec_MemAlloc( Abc_TtWordNum(i), 10 );
        Vec_MemHashAlloc( vTtMem[i], 1000 );
        vTt2Class[i] = Vec_IntStartFull( Gia_ManCoNum(p)+1 );
    }
    Gia_ObjComputeTruthTableStart( p, 16 );
    Gia_ManForEachPo( p, pObj, i )
    {
        iObj = Gia_ObjId(p, pObj);
        Gia_ManCollectCis( p, &iObj, 1, vLeaves );
        if ( Vec_IntSize(vLeaves) > 16 )
        {
            Vec_IntPush( Vec_WecPushLevel(vPosEquivs), i );
            continue;
        }
        pObj = Gia_ObjFanin0(pObj);
        if ( Gia_ObjIsConst0(pObj) )
        {
            if ( IndexCon == -1 )
            {
                IndexCon = Vec_WecSize(vPosEquivs);
                Vec_WecPushLevel(vPosEquivs);
            }
            Vec_WecPush( vPosEquivs, IndexCon, i );
            continue;
        }
        if ( Gia_ObjIsCi(pObj) )
        {
            if ( IndexVar == -1 )
            {
                IndexVar = Vec_WecSize(vPosEquivs);
                Vec_WecPushLevel(vPosEquivs);
            }
            Vec_WecPush( vPosEquivs, IndexVar, i );
            continue;
        }
        assert( Gia_ObjIsAnd(pObj) );
        pTruth = Gia_ObjComputeTruthTableCut( p, pObj, vLeaves );
        Abc_TtMinimumBase( pTruth, NULL, Vec_IntSize(vLeaves), &nVars );
        if ( nVars == 0 )
        {
            if ( IndexCon == -1 )
            {
                IndexCon = Vec_WecSize(vPosEquivs);
                Vec_WecPushLevel(vPosEquivs);
            }
            Vec_WecPush( vPosEquivs, IndexCon, i );
            continue;
        }
        if ( nVars == 1 )
        {
            if ( IndexVar == -1 )
            {
                IndexVar = Vec_WecSize(vPosEquivs);
                Vec_WecPushLevel(vPosEquivs);
            }
            Vec_WecPush( vPosEquivs, IndexVar, i );
            continue;
        }
        uCanonPhase = Abc_TtCanonicize( pTruth, nVars, pCanonPerm );
        lastId = Vec_MemEntryNum( vTtMem[nVars] );
        truthId = Vec_MemHashInsert( vTtMem[nVars], pTruth );
        if ( lastId != Vec_MemEntryNum( vTtMem[nVars] ) ) // new one
        {
            assert( Vec_IntEntry(vTt2Class[nVars], truthId) == -1 );
            Vec_IntWriteEntry( vTt2Class[nVars], truthId, Vec_WecSize(vPosEquivs) );
            Vec_WecPushLevel(vPosEquivs);
        }
        assert( Vec_IntEntry(vTt2Class[nVars], truthId) >= 0 );
        Vec_WecPush( vPosEquivs, Vec_IntEntry(vTt2Class[nVars], truthId), i );
    }
    Gia_ObjComputeTruthTableStop( p );
    Vec_IntFree( vLeaves );
    for ( i = 0; i < 17; i++ )
    {
        Vec_MemHashFree( vTtMem[i] );
        Vec_MemFree( vTtMem[i] );
        Vec_IntFree( vTt2Class[i] );
    }

    // find the first outputs and derive GIA
    vFirsts = Vec_WecCollectFirsts( vPosEquivs );
    pNew = Gia_ManDupCones( p, Vec_IntArray(vFirsts), Vec_IntSize(vFirsts), 0 );
    Vec_IntFree( vFirsts );
    // report and return    
    if ( fVerbose )
    { 
        printf( "Nontrivial classes:\n" );
        Vec_WecPrint( vPosEquivs, 1 );
    }
    if ( pvPosEquivs )
        *pvPosEquivs = Vec_WecConvertToVecPtr( vPosEquivs );
    Vec_WecFree( vPosEquivs );
    return pNew;
}